

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

space_info * ghc::filesystem::space(space_info *__return_storage_ptr__,path *p)

{
  bool bVar1;
  int code;
  filesystem_error *this;
  error_code ec_00;
  string local_40;
  undefined1 auStack_20 [8];
  error_code ec;
  path *p_local;
  
  ec._M_cat = (error_category *)p;
  std::error_code::error_code((error_code *)auStack_20);
  space(__return_storage_ptr__,(path *)ec._M_cat,(error_code *)auStack_20);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_20);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  code = std::error_code::value((error_code *)auStack_20);
  detail::systemErrorText<int>(&local_40,code);
  ec_00._0_8_ = (ulong)auStack_20 & 0xffffffff;
  ec_00._M_cat = (error_category *)ec._0_8_;
  filesystem_error::filesystem_error(this,&local_40,(path *)ec._M_cat,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE space_info space(const path& p)
{
    std::error_code ec;
    auto result = space(p, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}